

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  Point3f p1;
  Vector3f a;
  Point3f p0;
  Vector3f c;
  Point3f p2;
  byte bVar4;
  int iVar5;
  char *message;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  undefined1 extraout_var [56];
  undefined1 auVar18 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar12 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Vector3f VVar19;
  Vector3<float> z;
  initializer_list<float> __l;
  Vector3<float> local_118;
  Vector3<float> local_108;
  Vector3<float> local_f8;
  undefined1 local_e8 [16];
  aligned_storage_t<sizeof(pbrt::TriangleIntersection),_alignof(pbrt::TriangleIntersection)>
  local_d0;
  byte local_c0;
  Hammersley2DIter __begin2;
  AssertionResult gtest_ar;
  Float error;
  float fStack_84;
  uint64_t local_80;
  undefined1 local_78 [16];
  RNG rng;
  Frame frame;
  undefined1 auVar11 [64];
  undefined1 extraout_var_02 [56];
  
  for (local_80 = 0; local_80 != 100; local_80 = local_80 + 1) {
    pbrt::RNG::SetSequence(&rng,local_80);
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    local_e8._0_4_ = fVar8;
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = local_e8._0_4_;
    auVar18 = extraout_var;
    VVar19 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    local_108.super_Tuple3<pbrt::Vector3,_float>.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar18;
    uVar1 = vmovlps_avx(auVar11._0_16_);
    local_108.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_108.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    local_e8._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = local_e8._0_4_;
    auVar18 = extraout_var_00;
    VVar19 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    local_118.super_Tuple3<pbrt::Vector3,_float>.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar18;
    uVar1 = vmovlps_avx(auVar12._0_16_);
    local_118.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_118.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    local_e8._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = local_e8._0_4_;
    auVar18 = extraout_var_01;
    VVar19 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    local_f8.super_Tuple3<pbrt::Vector3,_float>.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar18;
    uVar1 = vmovlps_avx(auVar13._0_16_);
    local_f8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_f8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    auVar7._0_4_ = local_108.super_Tuple3<pbrt::Vector3,_float>.x +
                   local_118.super_Tuple3<pbrt::Vector3,_float>.x +
                   VVar19.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar7._4_4_ = local_108.super_Tuple3<pbrt::Vector3,_float>.y +
                   local_118.super_Tuple3<pbrt::Vector3,_float>.y +
                   VVar19.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar7._8_4_ = auVar18._0_4_ + 0.0;
    auVar7._12_4_ = auVar18._4_4_ + 0.0;
    auVar18 = ZEXT856(auVar7._8_8_);
    gtest_ar.message_.ptr_._0_4_ =
         local_f8.super_Tuple3<pbrt::Vector3,_float>.z +
         local_108.super_Tuple3<pbrt::Vector3,_float>.z +
         local_118.super_Tuple3<pbrt::Vector3,_float>.z;
    gtest_ar._0_8_ = vmovlps_avx(auVar7);
    z = pbrt::Normalize<float>((Vector3<float> *)&gtest_ar);
    fVar8 = z.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ = z.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar18;
    local_78 = auVar14._0_16_;
    local_e8 = vmovshdup_avx(local_78);
    pbrt::Frame::FromZ(&frame,(Vector3f)z.super_Tuple3<pbrt::Vector3,_float>);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_e8._0_4_ *
                                           local_108.super_Tuple3<pbrt::Vector3,_float>.y)),local_78
                             ,ZEXT416((uint)local_108.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar8),
                             ZEXT416((uint)local_108.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)((float)local_e8._0_4_ *
                                           local_118.super_Tuple3<pbrt::Vector3,_float>.y)),local_78
                             ,ZEXT416((uint)local_118.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar8),
                             ZEXT416((uint)local_118.super_Tuple3<pbrt::Vector3,_float>.z));
    gtest_ar._4_4_ = auVar3._0_4_;
    gtest_ar._0_4_ = auVar7._0_4_;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_e8._0_4_ *
                                           local_f8.super_Tuple3<pbrt::Vector3,_float>.y)),local_78,
                             ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar8),
                             ZEXT416((uint)local_f8.super_Tuple3<pbrt::Vector3,_float>.z));
    gtest_ar.message_.ptr_._0_4_ = auVar7._0_4_;
    __l._M_len = 3;
    __l._M_array = (iterator)&gtest_ar;
    fVar8 = std::min<float>(__l);
    a.super_Tuple3<pbrt::Vector3,_float>.y = local_108.super_Tuple3<pbrt::Vector3,_float>.y;
    a.super_Tuple3<pbrt::Vector3,_float>.x = local_108.super_Tuple3<pbrt::Vector3,_float>.x;
    a.super_Tuple3<pbrt::Vector3,_float>.z = local_108.super_Tuple3<pbrt::Vector3,_float>.z;
    VVar19.super_Tuple3<pbrt::Vector3,_float>.y = local_118.super_Tuple3<pbrt::Vector3,_float>.y;
    VVar19.super_Tuple3<pbrt::Vector3,_float>.x = local_118.super_Tuple3<pbrt::Vector3,_float>.x;
    VVar19.super_Tuple3<pbrt::Vector3,_float>.z = local_118.super_Tuple3<pbrt::Vector3,_float>.z;
    c.super_Tuple3<pbrt::Vector3,_float>.y = local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
    c.super_Tuple3<pbrt::Vector3,_float>.x = local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
    c.super_Tuple3<pbrt::Vector3,_float>.z = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
    FVar9 = pbrt::SphericalTriangleArea(a,VVar19,c);
    local_e8._0_4_ = FVar9;
    iVar6 = 0;
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = 0;
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.n = 40000;
    iVar5 = 0;
    while (iVar5 != 40000) {
      auVar15._0_8_ = pbrt::detail::Hammersley2DIter::operator*(&__begin2);
      auVar15._8_56_ = extraout_var_02;
      _error = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15._0_16_);
      if ((float)local_e8._0_4_ <= 3.1415927) {
        auVar18 = (undefined1  [56])0x0;
        VVar19 = pbrt::SampleUniformCone((Point2f *)&error,fVar8);
        VVar19 = pbrt::Frame::FromLocal(&frame,VVar19);
        auVar17._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar17._8_56_ = auVar18;
        auVar7 = auVar17._0_16_;
      }
      else {
        auVar18 = extraout_var_02;
        VVar19 = pbrt::SampleUniformSphere((Point2f *)&error);
        auVar16._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar16._8_56_ = auVar18;
        auVar7 = auVar16._0_16_;
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_._0_4_ = 0.0;
      uVar1 = vmovlps_avx(auVar7);
      gtest_ar.message_.ptr_._4_4_ = (undefined4)uVar1;
      p0.super_Tuple3<pbrt::Point3,_float>.y = local_108.super_Tuple3<pbrt::Vector3,_float>.y;
      p0.super_Tuple3<pbrt::Point3,_float>.x = local_108.super_Tuple3<pbrt::Vector3,_float>.x;
      p0.super_Tuple3<pbrt::Point3,_float>.z = local_108.super_Tuple3<pbrt::Vector3,_float>.z;
      p1.super_Tuple3<pbrt::Point3,_float>.y = local_118.super_Tuple3<pbrt::Vector3,_float>.y;
      p1.super_Tuple3<pbrt::Point3,_float>.x = local_118.super_Tuple3<pbrt::Vector3,_float>.x;
      p1.super_Tuple3<pbrt::Point3,_float>.z = local_118.super_Tuple3<pbrt::Vector3,_float>.z;
      p2.super_Tuple3<pbrt::Point3,_float>.y = local_f8.super_Tuple3<pbrt::Vector3,_float>.y;
      p2.super_Tuple3<pbrt::Point3,_float>.x = local_f8.super_Tuple3<pbrt::Vector3,_float>.x;
      p2.super_Tuple3<pbrt::Point3,_float>.z = local_f8.super_Tuple3<pbrt::Vector3,_float>.z;
      pbrt::IntersectTriangle
                ((optional<pbrt::TriangleIntersection> *)&local_d0.__align,(Ray *)&gtest_ar,INFINITY
                 ,p0,p1,p2);
      bVar4 = local_c0;
      pstd::optional<pbrt::TriangleIntersection>::~optional
                ((optional<pbrt::TriangleIntersection> *)&local_d0.__align);
      iVar6 = iVar6 + (uint)bVar4;
      iVar5 = __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i + 1;
      __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = iVar5;
    }
    local_d0.__align = (anon_struct_4_0_00000001_for___align)0x3d0f5c29;
    uVar1 = vcmpss_avx512f(ZEXT416((uint)local_e8._0_4_),ZEXT416(0x40490fdb),0xe);
    bVar2 = (bool)((byte)uVar1 & 1);
    fVar8 = (float)iVar6 /
            (float)((uint)bVar2 * 0x4546f194 +
                   (uint)!bVar2 * (int)((1.0 / ((1.0 - fVar8) * 6.2831855)) * 40000.0));
    auVar10._0_4_ = (fVar8 - (float)local_e8._0_4_) / (float)local_e8._0_4_;
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar10,auVar3);
    error = auVar7._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)&gtest_ar,"error","0.035f",(float *)&error,(float *)&local_d0.__align);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_d0.__align);
      std::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),"Area ");
      std::ostream::operator<<
                ((void *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),(float)local_e8._0_4_);
      std::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),", estimate ");
      std::ostream::operator<<((void *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),fVar8);
      std::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),", va = ");
      pbrt::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),&local_108);
      std::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),", vb = ");
      pbrt::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),&local_118);
      std::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),", vc = ");
      pbrt::operator<<((ostream *)(CONCAT44(local_d0._4_4_,local_d0.__align) + 0x10),&local_f8);
      message = "";
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
          (undefined8 *)0x0) {
        message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__begin2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&__begin2,(Message *)&local_d0.__align);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d0.__align);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}